

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_22::ValidateLoopMerge(ValidationState_t *_,Instruction *inst)

{
  Op OVar1;
  uint32_t uVar2;
  uint uVar3;
  DiagnosticStream *pDVar4;
  BasicBlock *this;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_00;
  size_type sVar5;
  bool bVar6;
  LoopControlShift local_f80 [2];
  DiagnosticStream local_f78;
  LoopControlShift local_d9c [4];
  uint local_d8c;
  undefined1 local_d88 [4];
  uint32_t operand;
  LoopControlShift local_bb0 [2];
  DiagnosticStream local_ba8;
  LoopControlShift local_9d0 [2];
  DiagnosticStream local_9c8;
  LoopControlShift local_7ec [3];
  undefined1 local_7e0 [4];
  LoopControlShift loop_control;
  string local_608;
  DiagnosticStream local_5e8;
  Instruction *local_410;
  Instruction *continue_target;
  undefined1 local_400 [4];
  uint continue_id;
  string local_228;
  DiagnosticStream local_208;
  Instruction *local_30;
  Instruction *merge;
  Instruction *pIStack_20;
  uint merge_id;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  merge._4_4_ = val::Instruction::GetOperandAs<unsigned_int>(inst,0);
  local_30 = ValidationState_t::FindDef((ValidationState_t *)inst_local,merge._4_4_);
  if ((local_30 == (Instruction *)0x0) ||
     (OVar1 = val::Instruction::opcode(local_30), uVar3 = merge._4_4_, OVar1 != OpLabel)) {
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    pDVar4 = DiagnosticStream::operator<<(&local_208,(char (*) [13])"Merge Block ");
    ValidationState_t::getIdName_abi_cxx11_(&local_228,(ValidationState_t *)inst_local,merge._4_4_);
    pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_228);
    pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [20])" must be an OpLabel");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
    std::__cxx11::string::~string((string *)&local_228);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  else {
    this = val::Instruction::block(pIStack_20);
    uVar2 = BasicBlock::id(this);
    if (uVar3 == uVar2) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_400,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                 pIStack_20);
      pDVar4 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_400,
                          (char (*) [61])
                          "Merge Block may not be the block containing the OpLoopMerge\n");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_400);
    }
    else {
      continue_target._4_4_ = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,1);
      local_410 = ValidationState_t::FindDef((ValidationState_t *)inst_local,continue_target._4_4_);
      if ((local_410 == (Instruction *)0x0) ||
         (OVar1 = val::Instruction::opcode(local_410), OVar1 != OpLabel)) {
        ValidationState_t::diag
                  (&local_5e8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar4 = DiagnosticStream::operator<<(&local_5e8,(char (*) [17])"Continue Target ");
        ValidationState_t::getIdName_abi_cxx11_
                  (&local_608,(ValidationState_t *)inst_local,continue_target._4_4_);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,&local_608);
        pDVar4 = DiagnosticStream::operator<<(pDVar4,(char (*) [20])" must be an OpLabel");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        std::__cxx11::string::~string((string *)&local_608);
        DiagnosticStream::~DiagnosticStream(&local_5e8);
      }
      else if (merge._4_4_ == continue_target._4_4_) {
        ValidationState_t::diag
                  ((DiagnosticStream *)local_7e0,(ValidationState_t *)inst_local,
                   SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar4 = DiagnosticStream::operator<<
                           ((DiagnosticStream *)local_7e0,
                            (char (*) [54])"Merge Block and Continue Target must be different ids");
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_7e0);
      }
      else {
        local_7ec[2] = val::Instruction::GetOperandAs<spv::LoopControlShift>(pIStack_20,2);
        local_7ec[1] = 0;
        uVar2 = operator>>(local_7ec + 2,local_7ec + 1);
        bVar6 = false;
        if ((uVar2 & 1) != 0) {
          local_7ec[0] = DontUnroll;
          uVar2 = operator>>(local_7ec + 2,local_7ec);
          bVar6 = (uVar2 & 1) != 0;
        }
        if (bVar6) {
          ValidationState_t::diag
                    (&local_9c8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
          pDVar4 = DiagnosticStream::operator<<
                             (&local_9c8,
                              (char (*) [63])
                              "Unroll and DontUnroll loop controls must not both be specified");
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
          DiagnosticStream::~DiagnosticStream(&local_9c8);
        }
        else {
          local_9d0[1] = 1;
          uVar2 = operator>>(local_7ec + 2,local_9d0 + 1);
          bVar6 = false;
          if ((uVar2 & 1) != 0) {
            local_9d0[0] = PeelCount;
            uVar2 = operator>>(local_7ec + 2,local_9d0);
            bVar6 = (uVar2 & 1) != 0;
          }
          if (bVar6) {
            ValidationState_t::diag
                      (&local_ba8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20)
            ;
            pDVar4 = DiagnosticStream::operator<<
                               (&local_ba8,
                                (char (*) [66])
                                "PeelCount and DontUnroll loop controls must not both be specified")
            ;
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
            DiagnosticStream::~DiagnosticStream(&local_ba8);
          }
          else {
            local_bb0[1] = 1;
            uVar2 = operator>>(local_7ec + 2,local_bb0 + 1);
            bVar6 = false;
            if ((uVar2 & 1) != 0) {
              local_bb0[0] = PartialCount;
              uVar2 = operator>>(local_7ec + 2,local_bb0);
              bVar6 = (uVar2 & 1) != 0;
            }
            if (bVar6) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_d88,(ValidationState_t *)inst_local,
                         SPV_ERROR_INVALID_DATA,pIStack_20);
              pDVar4 = DiagnosticStream::operator<<
                                 ((DiagnosticStream *)local_d88,
                                  (char (*) [69])
                                  "PartialCount and DontUnroll loop controls must not both be specified"
                                 );
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_d88);
            }
            else {
              local_d8c = 3;
              local_d9c[3] = 3;
              uVar2 = operator>>(local_7ec + 2,local_d9c + 3);
              if ((uVar2 & 1) != 0) {
                local_d8c = local_d8c + 1;
              }
              local_d9c[2] = 4;
              uVar2 = operator>>(local_7ec + 2,local_d9c + 2);
              if ((uVar2 & 1) != 0) {
                local_d8c = local_d8c + 1;
              }
              local_d9c[1] = 5;
              uVar2 = operator>>(local_7ec + 2,local_d9c + 1);
              if ((uVar2 & 1) != 0) {
                local_d8c = local_d8c + 1;
              }
              local_d9c[0] = IterationMultiple;
              uVar2 = operator>>(local_7ec + 2,local_d9c);
              if ((uVar2 & 1) != 0) {
                this_00 = val::Instruction::operands(pIStack_20);
                sVar5 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::
                        size(this_00);
                if ((sVar5 < local_d8c) ||
                   (uVar3 = val::Instruction::GetOperandAs<unsigned_int>
                                      (pIStack_20,(ulong)local_d8c), uVar3 == 0)) {
                  ValidationState_t::diag
                            (&local_f78,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                             pIStack_20);
                  pDVar4 = DiagnosticStream::operator<<
                                     (&local_f78,
                                      (char (*) [65])
                                      "IterationMultiple loop control operand must be greater than zero"
                                     );
                  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar4);
                  DiagnosticStream::~DiagnosticStream(&local_f78);
                  return __local._4_4_;
                }
                local_d8c = local_d8c + 1;
              }
              local_f80[1] = 7;
              uVar2 = operator>>(local_7ec + 2,local_f80 + 1);
              if ((uVar2 & 1) != 0) {
                local_d8c = local_d8c + 1;
              }
              local_f80[0] = PartialCount;
              operator>>(local_7ec + 2,local_f80);
              __local._4_4_ = SPV_SUCCESS;
            }
          }
        }
      }
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateLoopMerge(ValidationState_t& _, const Instruction* inst) {
  const auto merge_id = inst->GetOperandAs<uint32_t>(0);
  const auto merge = _.FindDef(merge_id);
  if (!merge || merge->opcode() != spv::Op::OpLabel) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Merge Block " << _.getIdName(merge_id) << " must be an OpLabel";
  }
  if (merge_id == inst->block()->id()) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Merge Block may not be the block containing the OpLoopMerge\n";
  }

  const auto continue_id = inst->GetOperandAs<uint32_t>(1);
  const auto continue_target = _.FindDef(continue_id);
  if (!continue_target || continue_target->opcode() != spv::Op::OpLabel) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Continue Target " << _.getIdName(continue_id)
           << " must be an OpLabel";
  }

  if (merge_id == continue_id) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Merge Block and Continue Target must be different ids";
  }

  const auto loop_control = inst->GetOperandAs<spv::LoopControlShift>(2);
  if ((loop_control >> spv::LoopControlShift::Unroll) & 0x1 &&
      (loop_control >> spv::LoopControlShift::DontUnroll) & 0x1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Unroll and DontUnroll loop controls must not both be specified";
  }
  if ((loop_control >> spv::LoopControlShift::DontUnroll) & 0x1 &&
      (loop_control >> spv::LoopControlShift::PeelCount) & 0x1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst) << "PeelCount and DontUnroll "
                                                   "loop controls must not "
                                                   "both be specified";
  }
  if ((loop_control >> spv::LoopControlShift::DontUnroll) & 0x1 &&
      (loop_control >> spv::LoopControlShift::PartialCount) & 0x1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst) << "PartialCount and "
                                                   "DontUnroll loop controls "
                                                   "must not both be specified";
  }

  uint32_t operand = 3;
  if ((loop_control >> spv::LoopControlShift::DependencyLength) & 0x1) {
    ++operand;
  }
  if ((loop_control >> spv::LoopControlShift::MinIterations) & 0x1) {
    ++operand;
  }
  if ((loop_control >> spv::LoopControlShift::MaxIterations) & 0x1) {
    ++operand;
  }
  if ((loop_control >> spv::LoopControlShift::IterationMultiple) & 0x1) {
    if (inst->operands().size() < operand ||
        inst->GetOperandAs<uint32_t>(operand) == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst) << "IterationMultiple loop "
                                                     "control operand must be "
                                                     "greater than zero";
    }
    ++operand;
  }
  if ((loop_control >> spv::LoopControlShift::PeelCount) & 0x1) {
    ++operand;
  }
  if ((loop_control >> spv::LoopControlShift::PartialCount) & 0x1) {
    ++operand;
  }

  // That the right number of operands is present is checked by the parser. The
  // above code tracks operands for expanded validation checking in the future.

  return SPV_SUCCESS;
}